

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::UberMaterial::readFrom(UberMaterial *this,BinaryReader *binary)

{
  Material::readFrom(&this->super_Material,binary);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->kd);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_kd);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->ks);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_ks);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->kr);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_kr);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->kt);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_kt);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->opacity);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_opacity);
  BinaryReader::read<float,void>(binary,&this->alpha);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_alpha);
  BinaryReader::read<float,void>(binary,&this->shadowAlpha);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_shadowAlpha);
  BinaryReader::read<float,void>(binary,&this->index);
  BinaryReader::read<float,void>(binary,&this->roughness);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_roughness);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_bump);
  return;
}

Assistant:

void UberMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(kd);
    binary.read(map_kd);
    binary.read(ks);
    binary.read(map_ks);
    binary.read(kr);
    binary.read(map_kr);
    binary.read(kt);
    binary.read(map_kt);
    binary.read(opacity);
    binary.read(map_opacity);
    binary.read(alpha);
    binary.read(map_alpha);
    binary.read(shadowAlpha);
    binary.read(map_shadowAlpha);
    binary.read(index);
    binary.read(roughness);
    binary.read(map_roughness);
    binary.read(map_bump);
  }